

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O2

void __thiscall
afsm::test::TranFSM_StaticHandledEvents_Test::TestBody(TranFSM_StaticHandledEvents_Test *this)

{
  event_set *peVar1;
  size_type sVar2;
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  AssertHelper local_2f8;
  string local_2f0;
  AssertionResult gtest_ar_;
  connection_fsm fsm;
  
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&fsm);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::connect>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x185,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::terminate>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x188,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::complete>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18b,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::conn_error>::id )","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18e,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id )",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x191,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::begin>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x194,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::commit>::id )","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x199,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::row_event>::id )","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19c,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0._M_dataplus._M_p = "";
  sVar2 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar1,(key_type *)&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar2 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_300);
    std::operator<<((ostream *)(local_300.ptr_ + 0x10),"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::command_complete>::id )",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19f,local_2f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine(&fsm);
  return;
}

Assistant:

TEST(TranFSM, StaticHandledEvents)
{
    connection_fsm fsm;

    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::connect>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::terminate>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::complete>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::conn_error>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::begin>::id ))
            << "Immediately handled event";


    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::commit>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::row_event>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::command_complete>::id ))
            << "Event handled by a nested state";
}